

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

Time __thiscall absl::DeadlineFromTimeout(absl *this,Duration timeout)

{
  __suseconds_t extraout_RDX;
  timeval tv_00;
  Duration rhs;
  Time TVar1;
  timeval tv;
  timeval local_38;
  Duration local_28;
  
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  tv_00.tv_usec = extraout_RDX;
  tv_00.tv_sec = local_38.tv_usec;
  TVar1 = TimeFromTimeval((absl *)local_38.tv_sec,tv_00);
  local_28.rep_hi_ = TVar1.rep_.rep_hi_;
  local_28.rep_lo_ = TVar1.rep_.rep_lo_;
  rhs._8_8_ = timeout.rep_hi_ & 0xffffffff;
  rhs.rep_hi_ = (int64_t)this;
  Duration::operator+=(&local_28,rhs);
  TVar1.rep_.rep_lo_ = local_28.rep_lo_;
  TVar1.rep_.rep_hi_ = local_28.rep_hi_;
  TVar1.rep_._12_4_ = 0;
  return (Time)TVar1.rep_;
}

Assistant:

static absl::Time DeadlineFromTimeout(absl::Duration timeout) {
#ifndef _WIN32
  struct timeval tv;
  gettimeofday(&tv, nullptr);
  return absl::TimeFromTimeval(tv) + timeout;
#else
  return absl::Now() + timeout;
#endif
}